

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathCompAndExpr(xmlXPathParserContextPtr ctxt)

{
  int ch1;
  byte *pbVar1;
  ulong uVar2;
  
  xmlXPathCompEqualityExpr(ctxt);
  if (ctxt->error == 0) {
    pbVar1 = ctxt->cur;
    while ((uVar2 = (ulong)*pbVar1, uVar2 < 0x21 && ((0x100002600U >> (uVar2 & 0x3f) & 1) != 0))) {
      pbVar1 = pbVar1 + 1;
      ctxt->cur = pbVar1;
    }
    while ((((char)uVar2 == 'a' && (pbVar1[1] == 0x6e)) && (pbVar1[2] == 100))) {
      ch1 = ctxt->comp->last;
      pbVar1 = pbVar1 + 3;
      while( true ) {
        ctxt->cur = pbVar1;
        if ((0x20 < (ulong)*pbVar1) || ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0)) break;
        pbVar1 = pbVar1 + 1;
      }
      xmlXPathCompEqualityExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_AND,0,0,0,(void *)0x0,(void *)0x0);
      pbVar1 = ctxt->cur;
      while ((uVar2 = (ulong)*pbVar1, uVar2 < 0x21 && ((0x100002600U >> (uVar2 & 0x3f) & 1) != 0)))
      {
        pbVar1 = pbVar1 + 1;
        ctxt->cur = pbVar1;
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompAndExpr(xmlXPathParserContextPtr ctxt) {
    xmlXPathCompEqualityExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == 'a') && (NXT(1) == 'n') && (NXT(2) == 'd')) {
	int op1 = ctxt->comp->last;
        SKIP(3);
	SKIP_BLANKS;
        xmlXPathCompEqualityExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_AND, op1, ctxt->comp->last, 0, 0);
	SKIP_BLANKS;
    }
}